

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

void xmlCleanupInputCallbacks(void)

{
  ulong uVar1;
  xlinkHandlerPtr *ppxVar2;
  
  if (xmlInputCallbackInitialized == '\x01') {
    uVar1 = (ulong)(uint)xmlInputCallbackNr;
    ppxVar2 = &xlinkDefaultHandler + uVar1 * 4;
    for (; 0 < (int)uVar1; uVar1 = (ulong)((int)uVar1 - 1)) {
      ppxVar2[2] = (xlinkHandlerPtr)0x0;
      ppxVar2[3] = (xlinkHandlerPtr)0x0;
      *ppxVar2 = (xlinkHandlerPtr)0x0;
      ppxVar2[1] = (xlinkHandlerPtr)0x0;
      ppxVar2 = ppxVar2 + -4;
    }
    xmlInputCallbackNr = 0;
    xmlInputCallbackInitialized = '\0';
  }
  return;
}

Assistant:

void
xmlCleanupInputCallbacks(void)
{
    int i;

    if (!xmlInputCallbackInitialized)
        return;

    for (i = xmlInputCallbackNr - 1; i >= 0; i--) {
        xmlInputCallbackTable[i].matchcallback = NULL;
        xmlInputCallbackTable[i].opencallback = NULL;
        xmlInputCallbackTable[i].readcallback = NULL;
        xmlInputCallbackTable[i].closecallback = NULL;
    }

    xmlInputCallbackNr = 0;
    xmlInputCallbackInitialized = 0;
}